

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PointerPrinter::PrintValue<dynlink_type>(dynlink_type *p,ostream *os)

{
  ostream *in_RSI;
  void *in_RDI;
  
  if (in_RDI == (void *)0x0) {
    std::operator<<(in_RSI,"NULL");
  }
  else {
    std::ostream::operator<<(in_RSI,in_RDI);
  }
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    }
  }